

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)1>::decode8
          (Predecoder<(InstructionSet::M68k::Model)1> *this,uint16_t instruction)

{
  ushort uVar1;
  uint16_t instruction_local;
  Predecoder<(InstructionSet::M68k::Model)1> *this_local;
  
  if ((instruction & 0x1f0) == 0x100) {
    this_local._4_4_ = decode<(unsigned_char)3,true>(this,instruction);
  }
  else {
    uVar1 = instruction & 0x1c0;
    if ((instruction & 0x1c0) == 0) {
      this_local._4_4_ = decode<(unsigned_char)206,true>(this,instruction);
    }
    else if (uVar1 == 0x40) {
      this_local._4_4_ = decode<(unsigned_char)207,true>(this,instruction);
    }
    else if (uVar1 == 0x80) {
      this_local._4_4_ = decode<(unsigned_char)208,true>(this,instruction);
    }
    else if (uVar1 == 0xc0) {
      this_local._4_4_ = decode<(unsigned_char)121,true>(this,instruction);
    }
    else if (uVar1 == 0x100) {
      this_local._4_4_ = decode<(unsigned_char)203,true>(this,instruction);
    }
    else if (uVar1 == 0x140) {
      this_local._4_4_ = decode<(unsigned_char)204,true>(this,instruction);
    }
    else if (uVar1 == 0x180) {
      this_local._4_4_ = decode<(unsigned_char)205,true>(this,instruction);
    }
    else if (uVar1 == 0x1c0) {
      this_local._4_4_ = decode<(unsigned_char)122,true>(this,instruction);
    }
    else {
      memset((void *)((long)&this_local + 4),0,4);
      Preinstruction::Preinstruction((Preinstruction *)((long)&this_local + 4));
    }
  }
  return this_local._4_4_;
}

Assistant:

Preinstruction Predecoder<model>::decode8(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0x1f0) {
		case 0x100:	Decode(Op::SBCD);	// 4-171 (p275)
		case 0x140:	DecodeReq(model >= Model::M68020, Op::PACK);	// 4-157 (p261)
		case 0x180:	DecodeReq(model >= Model::M68020, Op::UNPK);	// 4-196 (p300)

		default:	break;
	}

	switch(instruction & 0x1c0) {
		case 0x0c0:	Decode(Op::DIVUw);	// 4-97 (p201)
		case 0x1c0:	Decode(Op::DIVSw);	// 4-93 (p197)

		// 4-150 (p254)
		case 0x000:	Decode(ORtoRb);
		case 0x040:	Decode(ORtoRw);
		case 0x080:	Decode(ORtoRl);
		case 0x100:	Decode(ORtoMb);
		case 0x140:	Decode(ORtoMw);
		case 0x180:	Decode(ORtoMl);

		default:	break;
	}

	return Preinstruction();
}